

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O1

void __thiscall t_html_generator::~t_html_generator(t_html_generator *this)

{
  pointer pcVar1;
  
  (this->super_t_generator)._vptr_t_generator = (_func_int **)&PTR__t_html_generator_004102f8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->allowed_markup)._M_t);
  pcVar1 = (this->current_file_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->current_file_).field_2) {
    operator_delete(pcVar1);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            (&this->f_out_,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->f_out_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x98);
  t_generator::~t_generator(&this->super_t_generator);
  operator_delete(this);
  return;
}

Assistant:

t_html_generator(t_program* program,
                   const std::map<std::string, std::string>& parsed_options,
                   const std::string& option_string)
    : t_generator(program) {
    (void)option_string;
    std::map<std::string, std::string>::const_iterator iter;

    standalone_ = false;
    unsafe_ = false;
    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      if( iter->first.compare("standalone") == 0) {
        standalone_ = true;
      } else if( iter->first.compare("noescape") == 0) {
        unsafe_ = true;
      } else {
        throw "unknown option html:" + iter->first;
      }
    }


    out_dir_base_ = "gen-html";
    input_type_ = INPUT_UNKNOWN;

    escape_.clear();
    escape_['&'] = "&amp;";
    escape_['<'] = "&lt;";
    escape_['>'] = "&gt;";
    escape_['"'] = "&quot;";
    escape_['\''] = "&apos;";

    init_allowed__markup();
  }